

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseNewExpression
          (Parser *this,NameSyntax *newKeyword,
          bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  LanguageVersion LVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  ExpressionSyntax *expression;
  ParenthesizedExpressionSyntax *initializer;
  SourceLocation SVar4;
  Diagnostic *pDVar5;
  SuperNewDefaultedArgsExpressionSyntax *this_00;
  NewArrayExpressionSyntax *pNVar6;
  CopyClassExpressionSyntax *pCVar7;
  ArgumentListSyntax *argList;
  char *pcVar8;
  size_t sVar9;
  ScopedNameSyntax *scoped;
  TokenKind kind;
  Token TVar10;
  Token TVar11;
  Token TVar12;
  Token closeParen;
  SourceRange SVar13;
  string_view arg;
  Token local_40;
  
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  kind = TVar10.kind;
  if (kind == OpenBracket) {
    TVar10 = ParserBase::consume(&this->super_ParserBase);
    pEVar3 = parseExpression(this);
    TVar11 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar2) {
      TVar12 = ParserBase::consume(&this->super_ParserBase);
      expression = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      initializer = slang::syntax::SyntaxFactory::parenthesizedExpression
                              (&this->factory,TVar12,expression,closeParen);
    }
    else {
      initializer = (ParenthesizedExpressionSyntax *)0x0;
    }
    pNVar6 = slang::syntax::SyntaxFactory::newArrayExpression
                       (&this->factory,newKeyword,TVar10,pEVar3,TVar11,initializer);
  }
  else {
    if ((((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) &&
        (**(int **)&newKeyword[2].super_ExpressionSyntax.super_SyntaxNode == 0x67)) &&
       (TVar10 = slang::syntax::SyntaxNode::getLastToken
                           (*(SyntaxNode **)&newKeyword[1].super_ExpressionSyntax.super_SyntaxNode),
       TVar10.kind == SuperKeyword)) {
      bVar2 = true;
      if ((options.m_bits & 8) == 0) {
        local_40 = slang::syntax::SyntaxNode::getFirstToken
                             (*(SyntaxNode **)&newKeyword[2].super_ExpressionSyntax.super_SyntaxNode
                             );
        SVar4 = Token::location(&local_40);
        pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7a0005,SVar4);
        SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
        Diagnostic::operator<<(pDVar5,SVar13);
      }
    }
    else {
      bVar2 = false;
    }
    if (kind == OpenParenthesis) {
      if ((bVar2) &&
         (TVar10 = ParserBase::peek(&this->super_ParserBase,1), TVar10.kind == DefaultKeyword)) {
        TVar10 = ParserBase::consume(&this->super_ParserBase);
        TVar11 = ParserBase::consume(&this->super_ParserBase);
        TVar12 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        this_00 = slang::syntax::SyntaxFactory::superNewDefaultedArgsExpression
                            (&this->factory,newKeyword,TVar10,TVar11,TVar12);
        if (0 < (int)(this->parseOptions).languageVersion) {
          return &this_00->super_ExpressionSyntax;
        }
        SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,SVar13);
        LVar1 = (this->parseOptions).languageVersion;
        sVar9 = 9;
        if (LVar1 == Default) {
          pcVar8 = "1800-2017";
        }
        else if (LVar1 == v1800_2023) {
          pcVar8 = "1800-2023";
        }
        else {
          pcVar8 = "";
          sVar9 = 0;
        }
        arg._M_str = pcVar8;
        arg._M_len = sVar9;
        Diagnostic::operator<<(pDVar5,arg);
        return &this_00->super_ExpressionSyntax;
      }
      argList = parseArgumentList(this);
    }
    else {
      bVar2 = slang::syntax::SyntaxFacts::isPossibleExpression(kind);
      if (bVar2) {
        if ((newKeyword->super_ExpressionSyntax).super_SyntaxNode.kind != ConstructorName) {
          local_40 = ParserBase::peek(&this->super_ParserBase);
          SVar4 = Token::location(&local_40);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa10005,SVar4);
          SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)newKeyword);
          Diagnostic::operator<<(pDVar5,SVar13);
        }
        pEVar3 = parseExpression(this);
        pCVar7 = slang::syntax::SyntaxFactory::copyClassExpression(&this->factory,newKeyword,pEVar3)
        ;
        return &pCVar7->super_ExpressionSyntax;
      }
      argList = (ArgumentListSyntax *)0x0;
    }
    pNVar6 = (NewArrayExpressionSyntax *)
             slang::syntax::SyntaxFactory::newClassExpression(&this->factory,newKeyword,argList);
  }
  return &pNVar6->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseNewExpression(NameSyntax& newKeyword,
                                             bitmask<ExpressionOptions> options) {
    // If we see an open bracket, this is a dynamic array new expression.
    auto kind = peek().kind;
    if (kind == TokenKind::OpenBracket) {
        auto openBracket = consume();
        auto& sizeExpr = parseExpression();
        auto closeBracket = expect(TokenKind::CloseBracket);

        ParenthesizedExpressionSyntax* initializer = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& initializerExpr = parseExpression();
            initializer = &factory.parenthesizedExpression(openParen, initializerExpr,
                                                           expect(TokenKind::CloseParenthesis));
        }
        return factory.newArrayExpression(newKeyword, openBracket, sizeExpr, closeBracket,
                                          initializer);
    }

    // Enforce rules for super.new placement.
    bool isSuperNew = false;
    if (newKeyword.kind == SyntaxKind::ScopedName) {
        auto& scoped = newKeyword.as<ScopedNameSyntax>();
        if (scoped.right->kind == SyntaxKind::ConstructorName &&
            scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            isSuperNew = true;
            if (!options.has(ExpressionOptions::AllowSuperNewCall)) {
                addDiag(diag::InvalidSuperNew, scoped.right->getFirstToken().location())
                    << newKeyword.sourceRange();
            }
        }
    }

    // Otherwise this is a new-class or copy-class expression.
    // new-class has an optional argument list, copy-class has a required expression.
    // An open paren here would be ambiguous between an arg list and a parenthesized
    // expression -- we resolve by always taking the arg list.
    if (kind == TokenKind::OpenParenthesis) {
        // 1800-2023 added the construct super.new(default) -- check for that here.
        if (isSuperNew && peek(1).kind == TokenKind::DefaultKeyword) {
            auto openParen = consume();
            auto defaultKeyword = consume();
            auto& result = factory.superNewDefaultedArgsExpression(
                newKeyword, openParen, defaultKeyword, expect(TokenKind::CloseParenthesis));

            if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
                addDiag(diag::WrongLanguageVersion, result.sourceRange())
                    << toString(parseOptions.languageVersion);
            }

            return result;
        }
        return factory.newClassExpression(newKeyword, &parseArgumentList());
    }

    if (isPossibleExpression(kind)) {
        if (newKeyword.kind != SyntaxKind::ConstructorName)
            addDiag(diag::ScopedClassCopy, peek().location()) << newKeyword.sourceRange();
        return factory.copyClassExpression(newKeyword, parseExpression());
    }

    return factory.newClassExpression(newKeyword, nullptr);
}